

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O2

Value * Kvm::numberToString(Kvm *vm,Value *args)

{
  Value *pVVar1;
  string local_30;
  
  std::__cxx11::to_string(&local_30,(long)args[1]._vptr_Value >> 1);
  pVVar1 = makeString(vm,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return pVVar1;
}

Assistant:

const Value* Kvm::numberToString(Kvm *vm, const Value *args)
{
    long n = TK_INT(car(args));
    return vm->makeString(std::to_string(n));
}